

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O3

int xmlCurrentChar(xmlParserCtxtPtr ctxt,int *len)

{
  byte *pbVar1;
  byte bVar2;
  undefined8 in_RCX;
  ulong uVar3;
  xmlParserInputPtr in;
  uint uVar4;
  char buffer [150];
  xmlChar local_c8 [160];
  
  if (len == (int *)0x0 || ctxt == (xmlParserCtxtPtr)0x0) {
    return 0;
  }
  in = ctxt->input;
  if (in == (xmlParserInputPtr)0x0) {
    return 0;
  }
  if (ctxt->instate == XML_PARSER_EOF) {
    return 0;
  }
  pbVar1 = in->cur;
  bVar2 = *pbVar1;
  if ('\x1f' < (char)bVar2) {
    *len = 1;
LAB_00169a83:
    return (uint)*pbVar1;
  }
  if (ctxt->charset == 1) {
    if ((char)bVar2 < '\0') {
      if ((bVar2 != 0xc0 && (bVar2 & 0x40) != 0) && (pbVar1[1] == 0)) {
        xmlParserInputGrow(in,0xfa);
        in = ctxt->input;
      }
      pbVar1 = in->cur;
      if ((long)in->end - (long)pbVar1 < 4) {
        *len = 0;
        return 0;
      }
      snprintf((char *)local_c8,0x95,"Bytes: 0x%02X 0x%02X 0x%02X 0x%02X\n",(ulong)*pbVar1,
               (ulong)pbVar1[1],(ulong)pbVar1[2],(uint)pbVar1[3]);
      __xmlErrEncoding(ctxt,XML_ERR_INVALID_CHAR,
                       "Input is not proper UTF-8, indicate encoding !\n%s",local_c8,(xmlChar *)0x0)
      ;
      ctxt->charset = 10;
      *len = 1;
      pbVar1 = ctxt->input->cur;
      goto LAB_00169a83;
    }
    *len = 1;
    uVar3 = CONCAT71((int7)((ulong)in_RCX >> 8),*pbVar1);
    if (*pbVar1 == 0) {
      xmlParserInputGrow(in,0xfa);
      in = ctxt->input;
      pbVar1 = in->cur;
      uVar3 = CONCAT71((int7)(uVar3 >> 8),*pbVar1);
      if (*pbVar1 != 0) goto LAB_00169af6;
      if (pbVar1 < in->end) {
        xmlErrEncodingInt(ctxt,0x1f050b,(char *)0x0,(int)uVar3);
        in = ctxt->input;
        pbVar1 = in->cur;
        uVar3 = (ulong)*pbVar1;
        goto LAB_00169af6;
      }
      bVar2 = 0;
    }
    else {
LAB_00169af6:
      bVar2 = (byte)uVar3;
      if (bVar2 == 0xd) goto LAB_00169b16;
    }
    uVar4 = (uint)bVar2;
  }
  else {
    *len = 1;
    if (*pbVar1 != 0xd) {
      return (uint)*pbVar1;
    }
LAB_00169b16:
    uVar4 = 10;
    if (pbVar1[1] == 10) {
      in->cur = pbVar1 + 1;
    }
  }
  return uVar4;
}

Assistant:

int
xmlCurrentChar(xmlParserCtxtPtr ctxt, int *len) {
    if ((ctxt == NULL) || (len == NULL) || (ctxt->input == NULL)) return(0);
    if (ctxt->instate == XML_PARSER_EOF)
	return(0);

    if ((*ctxt->input->cur >= 0x20) && (*ctxt->input->cur <= 0x7F)) {
	    *len = 1;
	    return(*ctxt->input->cur);
    }
    if (ctxt->charset == XML_CHAR_ENCODING_UTF8) {
	/*
	 * We are supposed to handle UTF8, check it's valid
	 * From rfc2044: encoding of the Unicode values on UTF-8:
	 *
	 * UCS-4 range (hex.)           UTF-8 octet sequence (binary)
	 * 0000 0000-0000 007F   0xxxxxxx
	 * 0000 0080-0000 07FF   110xxxxx 10xxxxxx
	 * 0000 0800-0000 FFFF   1110xxxx 10xxxxxx 10xxxxxx
	 *
	 * Check for the 0x110000 limit too
	 */
	const unsigned char *cur = ctxt->input->cur;
	unsigned char c;
	unsigned int val;

	c = *cur;
	if (c & 0x80) {
	    if (((c & 0x40) == 0) || (c == 0xC0))
		goto encoding_error;
	    if (cur[1] == 0) {
		xmlParserInputGrow(ctxt->input, INPUT_CHUNK);
                cur = ctxt->input->cur;
            }
	    if ((cur[1] & 0xc0) != 0x80)
		goto encoding_error;
	    if ((c & 0xe0) == 0xe0) {
		if (cur[2] == 0) {
		    xmlParserInputGrow(ctxt->input, INPUT_CHUNK);
                    cur = ctxt->input->cur;
                }
		if ((cur[2] & 0xc0) != 0x80)
		    goto encoding_error;
		if ((c & 0xf0) == 0xf0) {
		    if (cur[3] == 0) {
			xmlParserInputGrow(ctxt->input, INPUT_CHUNK);
                        cur = ctxt->input->cur;
                    }
		    if (((c & 0xf8) != 0xf0) ||
			((cur[3] & 0xc0) != 0x80))
			goto encoding_error;
		    /* 4-byte code */
		    *len = 4;
		    val = (cur[0] & 0x7) << 18;
		    val |= (cur[1] & 0x3f) << 12;
		    val |= (cur[2] & 0x3f) << 6;
		    val |= cur[3] & 0x3f;
		    if (val < 0x10000)
			goto encoding_error;
		} else {
		  /* 3-byte code */
		    *len = 3;
		    val = (cur[0] & 0xf) << 12;
		    val |= (cur[1] & 0x3f) << 6;
		    val |= cur[2] & 0x3f;
		    if (val < 0x800)
			goto encoding_error;
		}
	    } else {
	      /* 2-byte code */
		*len = 2;
		val = (cur[0] & 0x1f) << 6;
		val |= cur[1] & 0x3f;
		if (val < 0x80)
		    goto encoding_error;
	    }
	    if (!IS_CHAR(val)) {
	        xmlErrEncodingInt(ctxt, XML_ERR_INVALID_CHAR,
				  "Char 0x%X out of allowed range\n", val);
	    }
	    return(val);
	} else {
	    /* 1-byte code */
	    *len = 1;
	    if (*ctxt->input->cur == 0)
		xmlParserInputGrow(ctxt->input, INPUT_CHUNK);
	    if ((*ctxt->input->cur == 0) &&
	        (ctxt->input->end > ctxt->input->cur)) {
	        xmlErrEncodingInt(ctxt, XML_ERR_INVALID_CHAR,
				  "Char 0x0 out of allowed range\n", 0);
	    }
	    if (*ctxt->input->cur == 0xD) {
		if (ctxt->input->cur[1] == 0xA) {
		    ctxt->input->cur++;
		}
		return(0xA);
	    }
	    return(*ctxt->input->cur);
	}
    }
    /*
     * Assume it's a fixed length encoding (1) with
     * a compatible encoding for the ASCII set, since
     * XML constructs only use < 128 chars
     */
    *len = 1;
    if (*ctxt->input->cur == 0xD) {
	if (ctxt->input->cur[1] == 0xA) {
	    ctxt->input->cur++;
	}
	return(0xA);
    }
    return(*ctxt->input->cur);
encoding_error:
    /*
     * An encoding problem may arise from a truncated input buffer
     * splitting a character in the middle. In that case do not raise
     * an error but return 0 to indicate an end of stream problem
     */
    if (ctxt->input->end - ctxt->input->cur < 4) {
	*len = 0;
	return(0);
    }

    /*
     * If we detect an UTF8 error that probably mean that the
     * input encoding didn't get properly advertised in the
     * declaration header. Report the error and switch the encoding
     * to ISO-Latin-1 (if you don't like this policy, just declare the
     * encoding !)
     */
    {
        char buffer[150];

	snprintf(&buffer[0], 149, "Bytes: 0x%02X 0x%02X 0x%02X 0x%02X\n",
			ctxt->input->cur[0], ctxt->input->cur[1],
			ctxt->input->cur[2], ctxt->input->cur[3]);
	__xmlErrEncoding(ctxt, XML_ERR_INVALID_CHAR,
		     "Input is not proper UTF-8, indicate encoding !\n%s",
		     BAD_CAST buffer, NULL);
    }
    ctxt->charset = XML_CHAR_ENCODING_8859_1;
    *len = 1;
    return(*ctxt->input->cur);
}